

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

string * __thiscall
pbrt::ConstantSpectrum::ToString_abi_cxx11_(string *__return_storage_ptr__,ConstantSpectrum *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&>
            (__return_storage_ptr__,"[ ConstantSpectrum c: %f ]",&this->c);
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantSpectrum::ToString() const {
    return StringPrintf("[ ConstantSpectrum c: %f ]", c);
}